

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::RunContext::handleExpr
          (RunContext *this,AssertionInfo *info,ITransientExpression *expr,
          AssertionReaction *reaction)

{
  bool negated;
  
  negated = SUB41((info->resultDisposition & FalseTest) >> 2,0);
  if (negated == expr->m_result) {
    reportExpr(this,info,ExpressionFailed,expr,negated);
    populateReaction(this,reaction);
  }
  else if (this->m_includeSuccessfulResults == false) {
    assertionPassed(this);
  }
  else {
    reportExpr(this,info,Ok,expr,negated);
  }
  (this->m_lastAssertionInfo).macroName.m_start = "";
  (this->m_lastAssertionInfo).macroName.m_size = 0;
  (this->m_lastAssertionInfo).capturedExpression.m_start =
       "{Unknown expression after the reported line}";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0x2c;
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  return;
}

Assistant:

void RunContext::handleExpr(
        AssertionInfo const& info,
        ITransientExpression const& expr,
        AssertionReaction& reaction
    ) {
        bool negated = isFalseTest( info.resultDisposition );
        bool result = expr.getResult() != negated;

        if( result ) {
            if (!m_includeSuccessfulResults) {
                assertionPassed();
            }
            else {
                reportExpr(info, ResultWas::Ok, &expr, negated);
            }
        }
        else {
            reportExpr(info, ResultWas::ExpressionFailed, &expr, negated );
            populateReaction( reaction );
        }
        resetAssertionInfo();
    }